

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall
args::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  char __rhs;
  undefined1 *puVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  int iVar4;
  OptionType OVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  Matcher *this_01;
  EitherFlag *this_02;
  pointer __rhs_00;
  iterator __end6;
  iterator __begin6;
  string *choice;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_01;
  bool bVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  string arg;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> flags;
  vector<args::Command_*,_std::allocator<args::Command_*>_> commands;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [8];
  string local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  long *local_88;
  long *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long *local_60;
  long *local_58;
  long *local_48;
  long *local_40;
  long *plVar6;
  
  if ((this->readCompletion & it._M_current + 1 == end._M_current) == 0) {
    return false;
  }
  iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(&local_48,this);
  OVar5 = ParseOption(this,it._M_current,true);
  if (local_48 == local_40) {
    if ((plVar6 != (long *)0x0) && ((*(byte *)(plVar6 + 1) & 0x40) == 0)) {
      if ((char)plVar6[0x13] == '\x01') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(plVar6 + 0x10));
      }
      else {
        (**(code **)(*plVar6 + 0x80))(local_100,plVar6,&this->helpParams);
      }
      _Var2._M_p = local_f8._M_p;
      choice = (string *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
      bVar8 = choice == (string *)local_f8._M_p;
      for (; choice != (string *)_Var2._M_p; choice = choice + 1) {
        AddCompletionReply(this,it._M_current,choice);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if (OVar5 == Positional && bVar8) goto LAB_0011178e;
    }
  }
  else {
    plVar6 = local_48;
    if ((OVar5 == Positional) || ((it._M_current)->_M_string_length == 0)) {
      do {
        if ((*(byte *)(*plVar6 + 8) & 0x40) == 0) {
          AddCompletionReply(this,it._M_current,(string *)(*plVar6 + 0x68));
        }
        plVar6 = plVar6 + 1;
      } while (plVar6 != local_40);
      goto LAB_0011178e;
    }
    do {
      if ((*(byte *)(*plVar6 + 8) & 0x40) == 0) {
        AddCompletionReply(this,it._M_current,(string *)(*plVar6 + 0x68));
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != local_40);
  }
  (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&local_60,this);
  local_88 = local_58;
  if (local_60 != local_58) {
    local_e8.field_2._M_allocated_capacity = (size_type)&this->shortprefix;
    local_e8.field_2._8_8_ = &this->longprefix;
    plVar6 = local_60;
    do {
      local_80 = plVar6;
      if ((*(byte *)(*plVar6 + 8) & 0x40) == 0) {
        this_01 = (Matcher *)(*plVar6 + 0xa0);
        Matcher::GetShortOrAny((EitherFlag *)local_100,this_01);
        EitherFlag::str((string *)local_c8,(EitherFlag *)local_100,
                        (string *)local_e8.field_2._M_allocated_capacity,
                        (string *)local_e8.field_2._8_8_);
        bVar8 = AddCompletionReply(this,it._M_current,(string *)local_c8);
        if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        if ((string *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p);
        }
        if (!bVar8) {
          Matcher::GetFlagStrings
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_c8,this_01
                    );
          uVar3 = local_c8._8_8_;
          this_02 = (EitherFlag *)local_c8._0_8_;
          if (local_c8._0_8_ != local_c8._8_8_) {
            do {
              EitherFlag::str((string *)local_100,this_02,
                              (string *)local_e8.field_2._M_allocated_capacity,
                              (string *)local_e8.field_2._8_8_);
              bVar8 = AddCompletionReply(this,it._M_current,(string *)local_100);
              puVar1 = (undefined1 *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
              if (puVar1 != local_f0) {
                operator_delete(puVar1);
              }
              this_02 = this_02 + 1;
            } while (!bVar8 && this_02 != (EitherFlag *)uVar3);
          }
          std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_c8);
        }
      }
      plVar6 = local_80 + 1;
    } while (plVar6 != local_88);
  }
  if (OVar5 == LongFlag) {
    if ((this->allowJoinedLongValue == true) && ((this->longseparator)._M_string_length != 0)) {
      local_e8.field_2._M_allocated_capacity = (size_type)&this->longseparator;
      uVar7 = std::__cxx11::string::find
                        ((char *)it._M_current,
                         (ulong)(((string *)local_e8.field_2._M_allocated_capacity)->_M_dataplus).
                                _M_p,0);
      if (uVar7 != 0xffffffffffffffff) {
LAB_001117ed:
        std::__cxx11::string::string((string *)local_c8,(string *)it._M_current,0,uVar7);
        std::__cxx11::string::substr((ulong)local_a8,(ulong)local_c8);
        local_100[0] = false;
        local_100[1] = '\0';
        local_f8._M_p = (pointer)&local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_a8._0_8_,(pointer)(local_a8._0_8_ + local_a8._8_8_));
        iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_100);
        plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
        if ((string *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10))
        {
          operator_delete((void *)local_a8._0_8_);
        }
        if (plVar6 != (long *)0x0) {
          if ((char)plVar6[0x13] == '\x01') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_78,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(plVar6 + 0x10));
          }
          else {
            (**(code **)(*plVar6 + 0x80))(&local_78,plVar6,&this->helpParams);
          }
          if (local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __rhs_00 = local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e8.field_2._M_allocated_capacity);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a8,__rhs_00);
              AddCompletionReply(this,it._M_current,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_100);
              puVar1 = (undefined1 *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
              if (puVar1 != local_f0) {
                operator_delete(puVar1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_a8 + 0x10)) {
                operator_delete((void *)local_a8._0_8_);
              }
              __rhs_00 = __rhs_00 + 1;
            } while (__rhs_00 !=
                     local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
        }
        if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
    }
  }
  else if ((OVar5 == ShortFlag) && (this->allowJoinedShortValue == true)) {
    uVar7 = (this->shortprefix)._M_string_length;
    if (uVar7 + 1 < (it._M_current)->_M_string_length) {
      if ((it._M_current)->_M_string_length <= uVar7) {
        uVar7 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_001117ed;
      }
      __rhs = ((it._M_current)->_M_dataplus)._M_p[uVar7];
      local_100[0] = true;
      local_f0 = (undefined1  [8])0x0;
      local_e8._M_dataplus._M_p._0_1_ = '\0';
      local_100[1] = __rhs;
      local_f8._M_p = (pointer)&local_e8;
      iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_100);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
      if ((string *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p);
      }
      if (plVar6 != (long *)0x0) {
        if ((char)plVar6[0x13] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(plVar6 + 0x10));
        }
        else {
          (**(code **)(*plVar6 + 0x80))(local_a8,plVar6,&this->helpParams);
        }
        local_e8.field_2._M_allocated_capacity = local_a8._8_8_;
        if (local_a8._0_8_ != local_a8._8_8_) {
          local_e8.field_2._8_8_ = &this->shortprefix;
          __rhs_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a8._0_8_;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e8.field_2._8_8_,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8,__rhs_01);
            AddCompletionReply(this,it._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_100);
            puVar1 = (undefined1 *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
            if (puVar1 != local_f0) {
              operator_delete(puVar1);
            }
            if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            __rhs_01 = __rhs_01 + 1;
          } while (__rhs_01 !=
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_e8.field_2._M_allocated_capacity);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
      }
    }
  }
  if (local_60 != (long *)0x0) {
    operator_delete(local_60);
  }
LAB_0011178e:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  CompletionFlag::Get_abi_cxx11_((string *)local_100,this->completion);
  std::runtime_error::runtime_error(this_00,(string *)local_100);
  *(undefined ***)this_00 = &PTR__runtime_error_0011bbe0;
  __cxa_throw(this_00,&Completion::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }